

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

void __thiscall
bloaty::Rollup::SortAndAggregateRows
          (Rollup *this,RollupRow *row,Rollup *base,Options *options,bool is_toplevel)

{
  vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *this_00;
  int64_t *buffer;
  uint uVar1;
  pointer __pos;
  size_t __n;
  __normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
  _Var2;
  __normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
  _Var3;
  ulong uVar4;
  long lVar5;
  Arg *pAVar6;
  pointer pRVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  Nonnull<char_*> pcVar11;
  const_iterator cVar12;
  pointer pRVar13;
  Rollup *base_00;
  __normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
  _Var14;
  Rollup *pRVar15;
  ulong uVar16;
  Arg *pAVar17;
  ulong uVar18;
  Arg *pAVar19;
  undefined7 in_register_00000081;
  Arg *a0;
  size_t in_R9;
  Rollup *this_01;
  long lVar20;
  bool bVar21;
  double dVar22;
  string_view format;
  string_view format_00;
  Rollup others_base;
  RollupRow others_row;
  Rollup others_rollup;
  string local_1d8;
  Rollup local_1b8;
  value_type local_150;
  Rollup local_c8;
  size_type local_68;
  int64_t *local_60;
  
  this_00 = &row->sorted_children;
  if ((((int)CONCAT71(in_register_00000081,is_toplevel) == 0) &&
      (pRVar13 = (row->sorted_children).
                 super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
                 super__Vector_impl_data._M_start,
      (long)(row->sorted_children).
            super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pRVar13 == 0x88)) &&
     ((iVar9 = std::__cxx11::string::compare((char *)pRVar13), iVar9 == 0 ||
      (iVar9 = std::__cxx11::string::compare
                         ((char *)(this_00->
                                  super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>
                                  )._M_impl.super__Vector_impl_data._M_start), iVar9 == 0)))) {
    std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::_M_erase_at_end
              (this_00,(this_00->
                       super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>).
                       _M_impl.super__Vector_impl_data._M_start);
  }
  __pos = (row->sorted_children).
          super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
          super__Vector_impl_data._M_start;
  if ((((long)(row->sorted_children).
              super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)__pos == 0x88) &&
      (__n = (__pos->name)._M_string_length, __n == (row->name)._M_string_length)) &&
     ((__n == 0 ||
      (iVar9 = bcmp((__pos->name)._M_dataplus._M_p,(row->name)._M_dataplus._M_p,__n), iVar9 == 0))))
  {
    std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::_M_erase_at_end
              (this_00,__pos);
  }
  _Var2._M_current =
       (row->sorted_children).
       super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
       super__Vector_impl_data._M_start;
  _Var3._M_current =
       (row->sorted_children).
       super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (_Var2._M_current != _Var3._M_current) {
    uVar1 = options->sort_by_;
    _Var14._M_current = _Var2._M_current;
    if (2 < uVar1) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc"
                    ,0x1e3,
                    "void bloaty::Rollup::SortAndAggregateRows(RollupRow *, const Rollup *, const Options &, bool) const"
                   );
    }
    do {
      if (uVar1 == 2) {
        uVar10 = ((_Var14._M_current)->size).file;
LAB_00180d57:
        uVar16 = -uVar10;
        if (0 < (long)uVar10) {
          uVar16 = uVar10;
        }
      }
      else {
        if (uVar1 == 1) {
          uVar10 = ((_Var14._M_current)->size).vm;
          goto LAB_00180d57;
        }
        uVar10 = ((_Var14._M_current)->size).vm;
        uVar4 = ((_Var14._M_current)->size).file;
        uVar18 = -uVar10;
        if (0 < (long)uVar10) {
          uVar18 = uVar10;
        }
        uVar16 = -uVar4;
        if (0 < (long)uVar4) {
          uVar16 = uVar4;
        }
        if (uVar16 < uVar18) {
          uVar16 = uVar18;
        }
      }
      (_Var14._M_current)->sortkey = uVar16;
      _Var14._M_current = _Var14._M_current + 1;
    } while (_Var14._M_current != _Var3._M_current);
    uVar10 = ((long)_Var3._M_current - (long)_Var2._M_current >> 3) * -0xf0f0f0f0f0f0f0f;
    lVar20 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar20 == 0; lVar20 = lVar20 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<bloaty::RollupRow*,std::vector<bloaty::RollupRow,std::allocator<bloaty::RollupRow>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(bloaty::RollupRow_const&,bloaty::RollupRow_const&)>>
              (_Var2,_Var3,(ulong)(((uint)lVar20 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_bloaty::RollupRow_&,_const_bloaty::RollupRow_&)>)
               0x188534);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<bloaty::RollupRow*,std::vector<bloaty::RollupRow,std::allocator<bloaty::RollupRow>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(bloaty::RollupRow_const&,bloaty::RollupRow_const&)>>
              (_Var2,_Var3,
               (_Iter_comp_iter<bool_(*)(const_bloaty::RollupRow_&,_const_bloaty::RollupRow_&)>)
               0x188534);
    local_150.name._M_dataplus._M_p = (pointer)&local_150.name.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,others_label_abi_cxx11_,DAT_006f2348 + others_label_abi_cxx11_);
    local_150.filtered_size.vm = 0;
    local_150.filtered_size.file = 0;
    local_150.size.vm = 0;
    local_150.size.file = 0;
    local_150.old_size.vm = 0;
    local_150.old_size.file = 0;
    local_150.sorted_children.
    super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_150.sorted_children.
    super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_150.sorted_children.
    super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_150.other_count =
         ((long)(row->sorted_children).
                super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(row->sorted_children).
                super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
                super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f0f0f0f0f -
         options->max_rows_per_level_;
    buffer = &local_c8.filtered_vm_total_;
    pcVar11 = absl::numbers_internal::FastIntToBuffer(local_150.other_count,(Nonnull<char_*>)buffer)
    ;
    local_c8.vm_total_ = (long)pcVar11 - (long)buffer;
    local_1b8.file_total_ = 0;
    local_1b8.filtered_vm_total_ = local_1b8.filtered_vm_total_ & 0xffffffffffffff00;
    a0 = (Arg *)0x1;
    format._M_str = (char *)&local_68;
    format._M_len = (size_t)"[$0 Others]";
    local_1b8.vm_total_ = (int64_t)&local_1b8.filtered_vm_total_;
    local_c8.file_total_ = (int64_t)buffer;
    local_68 = local_c8.vm_total_;
    local_60 = buffer;
    absl::substitute_internal::SubstituteAndAppendArray
              ((substitute_internal *)&local_1b8,(Nonnull<std::string_*>)0xb,format,
               (Nullable<const_absl::string_view_*>)0x1,in_R9);
    pRVar15 = &local_1b8;
    std::__cxx11::string::operator=((string *)&local_150,(string *)pRVar15);
    if ((int64_t *)local_1b8.vm_total_ != &local_1b8.filtered_vm_total_) {
      operator_delete((void *)local_1b8.vm_total_,local_1b8.filtered_vm_total_ + 1);
    }
    local_c8.children_._M_h._M_buckets = &local_c8.children_._M_h._M_single_bucket;
    local_c8.filter_regex_ = (ReImpl *)0x0;
    local_c8.filtered_vm_total_ = 0;
    local_c8.filtered_file_total_ = 0;
    local_c8.vm_total_ = 0;
    local_c8.file_total_ = 0;
    local_c8.children_._M_h._M_bucket_count = 1;
    local_c8.children_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_c8.children_._M_h._M_element_count = 0;
    local_c8.children_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_c8.children_._M_h._M_rehash_policy._M_next_resize = 0;
    local_c8.children_._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_1b8.children_._M_h._M_buckets = &local_1b8.children_._M_h._M_single_bucket;
    local_1b8.filter_regex_ = (ReImpl *)0x0;
    local_1b8.filtered_vm_total_ = 0;
    local_1b8.filtered_file_total_ = 0;
    local_1b8.vm_total_ = 0;
    local_1b8.file_total_ = 0;
    local_1b8.children_._M_h._M_bucket_count = 1;
    local_1b8.children_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_1b8.children_._M_h._M_element_count = 0;
    local_1b8.children_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_1b8.children_._M_h._M_rehash_policy._M_next_resize = 0;
    local_1b8.children_._M_h._M_single_bucket = (__node_base_ptr)0x0;
    lVar20 = (long)(row->sorted_children).
                   super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(row->sorted_children).
                   super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl
                   .super__Vector_impl_data._M_start;
    uVar10 = (lVar20 >> 3) * -0xf0f0f0f0f0f0f0f;
    while( true ) {
      uVar10 = uVar10 - 1;
      if (uVar10 < (ulong)options->max_rows_per_level_) break;
      pRVar13 = (this_00->super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = *(long *)((long)&pRVar13[-1].size.vm + lVar20);
      bVar21 = SCARRY8(local_150.size.vm,lVar5);
      local_150.size.vm = local_150.size.vm + lVar5;
      if ((bVar21) ||
         (lVar5 = *(long *)((long)&pRVar13[-1].size.file + lVar20),
         bVar21 = SCARRY8(local_150.size.file,lVar5),
         local_150.size.file = local_150.size.file + lVar5, bVar21)) goto LAB_001812f6;
      if ((base != (Rollup *)0x0) &&
         (cVar12 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&(base->children_)._M_h,
                          (key_type *)((long)&pRVar13[-1].name._M_dataplus._M_p + lVar20)),
         cVar12.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
         ._M_cur != (__node_type *)0x0)) {
        lVar5 = **(long **)((long)cVar12.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
                                  ._M_cur + 0x28);
        bVar21 = SCARRY8(local_1b8.vm_total_,lVar5);
        local_1b8.vm_total_ = local_1b8.vm_total_ + lVar5;
        if ((bVar21) ||
           (lVar5 = (*(long **)((long)cVar12.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
                                      ._M_cur + 0x28))[1],
           bVar21 = SCARRY8(local_1b8.file_total_,lVar5),
           local_1b8.file_total_ = local_1b8.file_total_ + lVar5, bVar21)) {
          Throw("integer overflow",0x7e);
        }
      }
      std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::_M_erase
                (this_00,(row->sorted_children).
                         super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>.
                         _M_impl.super__Vector_impl_data._M_finish + -1);
      lVar20 = lVar20 + -0x88;
    }
    if (local_150.size.file != 0 || local_150.size.vm != 0) {
      std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::push_back
                (this_00,&local_150);
      bVar21 = SCARRY8(local_c8.vm_total_,local_150.size.vm);
      local_c8.vm_total_ = local_c8.vm_total_ + local_150.size.vm;
      if ((bVar21) ||
         (bVar21 = SCARRY8(local_c8.file_total_,local_150.size.file),
         local_c8.file_total_ = local_c8.file_total_ + local_150.size.file, bVar21)) {
LAB_001812f6:
        Throw("integer overflow",0x7e);
      }
    }
    _Var2._M_current =
         (row->sorted_children).
         super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
         super__Vector_impl_data._M_start;
    _Var3._M_current =
         (row->sorted_children).
         super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (_Var2._M_current != _Var3._M_current) {
      uVar1 = options->sort_by_;
      _Var14._M_current = _Var2._M_current;
      if (2 < uVar1) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc"
                      ,0x218,
                      "void bloaty::Rollup::SortAndAggregateRows(RollupRow *, const Rollup *, const Options &, bool) const"
                     );
      }
      do {
        if (uVar1 == 2) {
          pAVar17 = (Arg *)((_Var14._M_current)->size).file;
LAB_001810c1:
          (_Var14._M_current)->sortkey = (int64_t)pAVar17;
        }
        else {
          if (uVar1 == 1) {
            pAVar17 = (Arg *)((_Var14._M_current)->size).vm;
            goto LAB_001810c1;
          }
          pAVar17 = (Arg *)((_Var14._M_current)->size).vm;
          pAVar6 = (Arg *)((_Var14._M_current)->size).file;
          pAVar19 = (Arg *)-(long)pAVar17;
          if (0 < (long)pAVar17) {
            pAVar19 = pAVar17;
          }
          a0 = (Arg *)-(long)pAVar6;
          if (0 < (long)pAVar6) {
            a0 = pAVar6;
          }
          if (a0 < pAVar19) goto LAB_001810c1;
          (_Var14._M_current)->sortkey = (int64_t)pAVar6;
        }
        _Var14._M_current = _Var14._M_current + 1;
      } while (_Var14._M_current != _Var3._M_current);
    }
    if (_Var2._M_current != _Var3._M_current) {
      uVar10 = ((long)_Var3._M_current - (long)_Var2._M_current >> 3) * -0xf0f0f0f0f0f0f0f;
      lVar20 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar20 == 0; lVar20 = lVar20 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<bloaty::RollupRow*,std::vector<bloaty::RollupRow,std::allocator<bloaty::RollupRow>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(bloaty::RollupRow_const&,bloaty::RollupRow_const&)>>
                (_Var2,_Var3,(ulong)(((uint)lVar20 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(const_bloaty::RollupRow_&,_const_bloaty::RollupRow_&)>)
                 0x188534);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<bloaty::RollupRow*,std::vector<bloaty::RollupRow,std::allocator<bloaty::RollupRow>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(bloaty::RollupRow_const&,bloaty::RollupRow_const&)>>
                (_Var2,_Var3,
                 (_Iter_comp_iter<bool_(*)(const_bloaty::RollupRow_&,_const_bloaty::RollupRow_&)>)
                 0x188534);
    }
    if (base == (Rollup *)0x0) {
      pRVar13 = (row->sorted_children).
                super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
                super__Vector_impl_data._M_start;
      pRVar7 = (row->sorted_children).
               super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pRVar13 != pRVar7) {
        lVar20 = (row->size).vm;
        lVar5 = (row->size).file;
        do {
          lVar8 = (pRVar13->size).vm;
          if (lVar20 == 0) {
            dVar22 = NAN;
            if (lVar8 != 0) {
              dVar22 = *(double *)(&DAT_00345ea0 + (ulong)(0 < lVar8) * 8);
            }
          }
          else {
            dVar22 = ((double)lVar8 / (double)lVar20) * 100.0;
          }
          pRVar13->vmpercent = dVar22;
          a0 = (Arg *)(pRVar13->size).file;
          if (lVar5 == 0) {
            dVar22 = NAN;
            if (a0 != (Arg *)0x0) {
              a0 = (Arg *)(ulong)(0 < (long)a0);
              dVar22 = *(double *)(&DAT_00345ea0 + (long)a0 * 8);
            }
          }
          else {
            dVar22 = ((double)(long)a0 / (double)lVar5) * 100.0;
          }
          pRVar13->filepercent = dVar22;
          pRVar13 = pRVar13 + 1;
        } while (pRVar13 != pRVar7);
      }
    }
    pRVar13 = (row->sorted_children).
              super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
              super__Vector_impl_data._M_start;
    pRVar7 = (row->sorted_children).
             super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pRVar13 != pRVar7) {
      if (base == (Rollup *)0x0) {
        pRVar15 = (Rollup *)0x0;
      }
      do {
        base_00 = pRVar15;
        this_01 = &local_c8;
        if (pRVar13->other_count < 1) {
          cVar12 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&(this->children_)._M_h,&pRVar13->name);
          if (cVar12.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            local_60 = (int64_t *)(pRVar13->name)._M_dataplus._M_p;
            local_68 = (pRVar13->name)._M_string_length;
            format_00._M_str = (char *)&local_68;
            format_00._M_len = (size_t)"internal error, couldn\'t find name $0";
            absl::Substitute_abi_cxx11_(&local_1d8,(absl *)0x25,format_00,a0);
            Throw(local_1d8._M_dataplus._M_p,0x233);
          }
          this_01 = *(Rollup **)
                     ((long)cVar12.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
                            ._M_cur + 0x28);
          if (this_01 == (Rollup *)0x0) {
            __assert_fail("child_rollup",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc"
                          ,0x236,
                          "void bloaty::Rollup::SortAndAggregateRows(RollupRow *, const Rollup *, const Options &, bool) const"
                         );
          }
          if (base == (Rollup *)0x0) {
            base_00 = (Rollup *)0x0;
          }
          else {
            cVar12 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&(base->children_)._M_h,&pRVar13->name);
            if (cVar12.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              base_00 = GetEmpty();
            }
            else {
              base_00 = *(Rollup **)
                         ((long)cVar12.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
                                ._M_cur + 0x28);
            }
          }
        }
        a0 = (Arg *)0x0;
        CreateRows(this_01,pRVar13,base_00,options,false);
        pRVar13 = pRVar13 + 1;
      } while (pRVar13 != pRVar7);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_1b8.children_._M_h);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_c8.children_._M_h);
    std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::~vector
              (&local_150.sorted_children);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150.name._M_dataplus._M_p != &local_150.name.field_2) {
      operator_delete(local_150.name._M_dataplus._M_p,
                      local_150.name.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void Rollup::SortAndAggregateRows(RollupRow* row, const Rollup* base,
                                  const Options& options,
                                  bool is_toplevel) const {
  std::vector<RollupRow>& child_rows = row->sorted_children;

  // We don't want to output a solitary "[None]" or "[Unmapped]" row except at
  // the top level.
  if (!is_toplevel && child_rows.size() == 1 &&
      (child_rows[0].name == "[None]" || child_rows[0].name == "[Unmapped]")) {
    child_rows.clear();
  }

  // We don't want to output a single row that has exactly the same size and
  // label as the parent.
  if (child_rows.size() == 1 && child_rows[0].name == row->name) {
    child_rows.clear();
  }

  if (child_rows.empty()) {
    return;
  }

  // First sort by magnitude.
  for (auto& child : child_rows) {
    switch (options.sort_by()) {
      case Options::SORTBY_VMSIZE:
        child.sortkey = std::abs(child.size.vm);
        break;
      case Options::SORTBY_FILESIZE:
        child.sortkey = std::abs(child.size.file);
        break;
      case Options::SORTBY_BOTH:
        child.sortkey =
            std::max(std::abs(child.size.vm), std::abs(child.size.file));
        break;
      default:
        BLOATY_UNREACHABLE();
    }
  }

  std::sort(child_rows.begin(), child_rows.end(), &RollupRow::Compare);

  RollupRow others_row(others_label);
  others_row.other_count = child_rows.size() - options.max_rows_per_level();
  others_row.name = absl::Substitute("[$0 Others]", others_row.other_count);
  Rollup others_rollup;
  Rollup others_base;

  // Filter out everything but the top 'row_limit'.  Add rows that were filtered
  // out to "others_row".
  size_t i = child_rows.size() - 1;
  while (i >= options.max_rows_per_level()) {
    CheckedAdd(&others_row.size.vm, child_rows[i].size.vm);
    CheckedAdd(&others_row.size.file, child_rows[i].size.file);
    if (base) {
      auto it = base->children_.find(child_rows[i].name);
      if (it != base->children_.end()) {
        CheckedAdd(&others_base.vm_total_, it->second->vm_total_);
        CheckedAdd(&others_base.file_total_, it->second->file_total_);
      }
    }

    child_rows.erase(child_rows.end() - 1);
    i--;
  }

  if (std::abs(others_row.size.vm) > 0 || std::abs(others_row.size.file) > 0) {
    child_rows.push_back(others_row);
    CheckedAdd(&others_rollup.vm_total_, others_row.size.vm);
    CheckedAdd(&others_rollup.file_total_, others_row.size.file);
  }

  // Now sort by actual value (positive or negative).
  for (auto& child : child_rows) {
    switch (options.sort_by()) {
      case Options::SORTBY_VMSIZE:
        child.sortkey = child.size.vm;
        break;
      case Options::SORTBY_FILESIZE:
        child.sortkey = child.size.file;
        break;
      case Options::SORTBY_BOTH:
        if (std::abs(child.size.vm) > std::abs(child.size.file)) {
          child.sortkey = child.size.vm;
        } else {
          child.sortkey = child.size.file;
        }
        break;
      default:
        BLOATY_UNREACHABLE();
    }
  }

  std::sort(child_rows.begin(), child_rows.end(), &RollupRow::Compare);

  // For a non-diff, the percentage is compared to the total size of the parent.
  if (!base) {
    for (auto& child_row : child_rows) {
      child_row.vmpercent = Percent(child_row.size.vm, row->size.vm);
      child_row.filepercent = Percent(child_row.size.file, row->size.file);
    }
  }

  // Recurse into sub-rows, (except "Other", which isn't a real row).
  for (auto& child_row : child_rows) {
    const Rollup* child_rollup;
    const Rollup* child_base = nullptr;

    if (child_row.other_count > 0) {
      child_rollup = &others_rollup;
      if (base) {
        child_base = &others_base;
      }
    } else {
      auto it = children_.find(child_row.name);
      if (it == children_.end()) {
        THROWF("internal error, couldn't find name $0", child_row.name);
      }
      child_rollup = it->second.get();
      assert(child_rollup);

      if (base) {
        auto it = base->children_.find(child_row.name);
        if (it == base->children_.end()) {
          child_base = GetEmpty();
        } else {
          child_base = it->second.get();
        }
      }
    }

    child_rollup->CreateRows(&child_row, child_base, options, false);
  }
}